

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

Vec_Int_t * Gia_ManOrigIdsRemapPairs(Vec_Int_t *vEquivPairs,int nObjs)

{
  int iVar1;
  Vec_Int_t *vMap;
  int *__s;
  Vec_Int_t *pVVar2;
  int *__s_00;
  long lVar3;
  ulong uVar4;
  
  vMap = (Vec_Int_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < nObjs - 1U) {
    iVar1 = nObjs;
  }
  vMap->nSize = 0;
  vMap->nCap = iVar1;
  if (iVar1 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar1 * 4);
  }
  vMap->pArray = __s;
  vMap->nSize = nObjs;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)nObjs * 4);
  }
  if (1 < vEquivPairs->nSize) {
    lVar3 = 1;
    do {
      Gia_ManOrigIdsRemapPairsInsert
                (vMap,vEquivPairs->pArray[lVar3 + -1],vEquivPairs->pArray[lVar3]);
      lVar3 = lVar3 + 2;
    } while ((int)lVar3 < vEquivPairs->nSize);
  }
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar1;
  if (iVar1 == 0) {
    __s_00 = (int *)0x0;
  }
  else {
    __s_00 = (int *)malloc((long)iVar1 << 2);
  }
  pVVar2->pArray = __s_00;
  pVVar2->nSize = nObjs;
  if (__s_00 != (int *)0x0) {
    memset(__s_00,0xff,(long)nObjs << 2);
  }
  if (0 < nObjs) {
    uVar4 = 0;
    do {
      if (-1 < __s[uVar4]) {
        iVar1 = Gia_ManOrigIdsRemapPairsExtract(vMap,__s[uVar4]);
        __s_00[uVar4] = iVar1;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)nObjs != uVar4);
  }
  if (__s != (int *)0x0) {
    free(__s);
    vMap->pArray = (int *)0x0;
  }
  free(vMap);
  return pVVar2;
}

Assistant:

Vec_Int_t * Gia_ManOrigIdsRemapPairs( Vec_Int_t * vEquivPairs, int nObjs )
{
    Vec_Int_t * vMapResult;
    Vec_Int_t * vMap2Smaller;
    int i, One, Two;
    // map bigger into smaller one
    vMap2Smaller = Vec_IntStartFull( nObjs );
    Vec_IntForEachEntryDouble( vEquivPairs, One, Two, i )
        Gia_ManOrigIdsRemapPairsInsert( vMap2Smaller, One, Two );
    // collect results in the topo order
    vMapResult = Vec_IntStartFull( nObjs );
    Vec_IntForEachEntry( vMap2Smaller, One, i )
        if ( One >= 0 )
            Vec_IntWriteEntry( vMapResult, i, Gia_ManOrigIdsRemapPairsExtract(vMap2Smaller, One) );
    Vec_IntFree( vMap2Smaller );
    return vMapResult;
}